

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall
QPDFJob::getUOPagenos
          (QPDFJob *this,vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_> *uos,
          map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
          *pagenos)

{
  pointer piVar1;
  mapped_type *pmVar2;
  mapped_type *this_00;
  const_reference __x;
  ulong __n;
  ulong uVar3;
  vector<int,_std::allocator<int>_> *this_01;
  pointer piVar4;
  ulong uVar5;
  int to_pageno;
  size_t uo_idx;
  int local_7c;
  key_type_conflict local_78;
  pointer local_70;
  pointer local_68;
  long local_60;
  ulong local_58;
  vector<int,_std::allocator<int>_> *local_50;
  pointer local_48;
  pointer local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  local_78 = 0;
  local_68 = (uos->super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_70 = (uos->super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (local_68 == local_70) {
      return;
    }
    local_38 = &local_68->from_pagenos;
    uVar5 = (long)(local_68->from_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(local_68->from_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    local_50 = &local_68->repeat_pagenos;
    local_40 = (local_68->repeat_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    local_48 = (local_68->repeat_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_58 = (long)local_40 - (long)local_48 >> 2;
    piVar1 = (local_68->to_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_60 = -uVar5;
    uVar3 = 0;
    for (piVar4 = (local_68->to_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar4 != piVar1; piVar4 = piVar4 + 1) {
      local_7c = *piVar4;
      if (uVar3 < uVar5) {
        pmVar2 = std::
                 map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                 ::operator[](pagenos,&local_7c);
        this_00 = std::
                  map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::operator[](pmVar2,&local_78);
        __n = uVar3;
        this_01 = local_38;
LAB_0016a962:
        __x = std::vector<int,_std::allocator<int>_>::at(this_01,__n);
        std::vector<int,_std::allocator<int>_>::push_back(this_00,__x);
      }
      else if (local_40 != local_48) {
        pmVar2 = std::
                 map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                 ::operator[](pagenos,&local_7c);
        this_00 = std::
                  map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::operator[](pmVar2,&local_78);
        __n = (local_60 + uVar3) % local_58;
        this_01 = local_50;
        goto LAB_0016a962;
      }
      uVar3 = uVar3 + 1;
    }
    local_78 = local_78 + 1;
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

void
QPDFJob::getUOPagenos(
    std::vector<QPDFJob::UnderOverlay>& uos,
    std::map<int, std::map<size_t, std::vector<int>>>& pagenos)
{
    size_t uo_idx = 0;
    for (auto const& uo: uos) {
        size_t page_idx = 0;
        size_t from_size = uo.from_pagenos.size();
        size_t repeat_size = uo.repeat_pagenos.size();
        for (int to_pageno: uo.to_pagenos) {
            if (page_idx < from_size) {
                pagenos[to_pageno][uo_idx].push_back(uo.from_pagenos.at(page_idx));
            } else if (repeat_size) {
                pagenos[to_pageno][uo_idx].push_back(
                    uo.repeat_pagenos.at((page_idx - from_size) % repeat_size));
            }
            ++page_idx;
        }
        ++uo_idx;
    }
}